

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  base_uint<256U> *in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != in_RSI) {
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      in_RDI->pn[local_1c] = in_RSI->pn[local_1c];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

base_uint& operator=(const base_uint& b)
    {
        if (this != &b) {
            for (int i = 0; i < WIDTH; i++)
                pn[i] = b.pn[i];
        }
        return *this;
    }